

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

bool __thiscall
libchars::command_cursor::subword(command_cursor *this,filter_t mask,bool ignore_hidden)

{
  bool bVar1;
  command_node *pcVar2;
  bool local_1a;
  bool ignore_hidden_local;
  filter_t mask_local;
  command_cursor *this_local;
  
  bVar1 = valid(this);
  local_1a = false;
  if (bVar1) {
    pcVar2 = current(this);
    local_1a = false;
    if (((pcVar2->mask & mask) != 0) &&
       ((pcVar2 = current(this), (pcVar2->hidden & 1U) == 0 || (local_1a = false, ignore_hidden))))
    {
      pcVar2 = current(this);
      local_1a = pcVar2->start != (command_node *)0x0;
    }
  }
  return local_1a;
}

Assistant:

bool command_cursor::subword(command::filter_t mask, bool ignore_hidden) const
    {
        return valid() &&
               (current()->mask & mask) != 0 &&
               (!current()->hidden || ignore_hidden) &&
               current()->start != NULL;
    }